

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUMap.hh
# Opt level: O3

void __thiscall
phosg::
LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::unlink_item(LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,Item *i)

{
  Item *pIVar1;
  Item *pIVar2;
  
  if (this->head == i) {
    this->head = i->next;
  }
  pIVar1 = i->prev;
  if (this->tail == i) {
    this->tail = pIVar1;
  }
  pIVar2 = i->next;
  if (pIVar1 != (Item *)0x0) {
    pIVar1->next = pIVar2;
  }
  if (pIVar2 != (Item *)0x0) {
    pIVar2->prev = pIVar1;
  }
  i->prev = (Item *)0x0;
  i->next = (Item *)0x0;
  return;
}

Assistant:

void unlink_item(Item* i) const {
    if (this->head == i) {
      this->head = i->next;
    }
    if (this->tail == i) {
      this->tail = i->prev;
    }
    if (i->prev) {
      i->prev->next = i->next;
    }
    if (i->next) {
      i->next->prev = i->prev;
    }
    i->prev = nullptr;
    i->next = nullptr;
  }